

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeComponentGraph.cxx
# Opt level: O3

void __thiscall cmComputeComponentGraph::TransferEdges(cmComputeComponentGraph *this)

{
  int iVar1;
  pointer pcVar2;
  uint uVar3;
  pointer pcVar4;
  ulong uVar5;
  pointer pcVar6;
  cmGraphEdge local_38;
  
  uVar3 = (int)((long)(this->InputGraph->
                      super_vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>).
                      super__Vector_base<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)(this->InputGraph->
                      super_vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>).
                      super__Vector_base<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>._M_impl.
                      super__Vector_impl_data._M_start >> 3) * -0x55555555;
  if (0 < (int)uVar3) {
    uVar5 = 0;
    do {
      pcVar2 = (this->InputGraph->super_vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>).
               super__Vector_base<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>._M_impl.
               super__Vector_impl_data._M_start;
      pcVar6 = *(pointer *)&pcVar2[uVar5].super_vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>;
      pcVar4 = *(pointer *)((long)(pcVar2 + uVar5) + 8);
      if (pcVar6 != pcVar4) {
        iVar1 = (this->TarjanComponents).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start[uVar5];
        do {
          local_38.Dest =
               (this->TarjanComponents).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start[pcVar6->Dest];
          if (iVar1 != local_38.Dest) {
            local_38.Strong = pcVar6->Strong;
            std::vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>::emplace_back<cmGraphEdge>
                      (&(this->ComponentGraph).
                        super_vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>.
                        super__Vector_base<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>.
                        _M_impl.super__Vector_impl_data._M_start[iVar1].
                        super_vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>,&local_38);
            pcVar4 = *(pointer *)((long)(pcVar2 + uVar5) + 8);
          }
          pcVar6 = pcVar6 + 1;
        } while (pcVar6 != pcVar4);
      }
      uVar5 = uVar5 + 1;
    } while (uVar5 != (uVar3 & 0x7fffffff));
  }
  return;
}

Assistant:

void cmComputeComponentGraph::TransferEdges()
{
  // Map inter-component edges in the original graph to edges in the
  // component graph.
  int n = static_cast<int>(this->InputGraph.size());
  for(int i=0; i < n; ++i)
    {
    int i_component = this->TarjanComponents[i];
    EdgeList const& nl = this->InputGraph[i];
    for(EdgeList::const_iterator ni = nl.begin(); ni != nl.end(); ++ni)
      {
      int j = *ni;
      int j_component = this->TarjanComponents[j];
      if(i_component != j_component)
        {
        // We do not attempt to combine duplicate edges, but instead
        // store the inter-component edges with suitable multiplicity.
        this->ComponentGraph[i_component].push_back(
          cmGraphEdge(j_component, ni->IsStrong()));
        }
      }
    }
}